

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O2

char * ysimple_name(obj *obj)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *__src;
  
  nextobuf_bufidx = (nextobuf_bufidx + 1) % 0xc;
  pcVar1 = shk_your(nextobuf_bufs + (long)nextobuf_bufidx * 0x100,obj);
  sVar2 = strlen(pcVar1);
  sVar3 = strlen(pcVar1);
  (pcVar1 + sVar3)[0] = ' ';
  (pcVar1 + sVar3)[1] = '\0';
  __src = simple_typename((int)obj->otyp);
  pcVar1 = strncat(pcVar1,__src,(long)(0xfe - (int)sVar2));
  return pcVar1;
}

Assistant:

char *ysimple_name(const struct obj *obj)
{
	char *outbuf = nextobuf();
	char *s = shk_your(outbuf, obj);	/* assert( s == outbuf ); */
	int space_left = BUFSZ - strlen(s) - sizeof " ";

	return strncat(strcat(s, " "), simple_typename(obj->otyp), space_left);
}